

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_vm.c
# Opt level: O2

_Bool gravity_vm_runclosure
                (gravity_vm *vm,gravity_closure_t *closure,gravity_value_t sender,
                gravity_value_t *params,uint16_t nparams)

{
  gravity_value_t *pgVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  gravity_exec_type gVar9;
  gravity_function_t *pgVar10;
  gravity_vm *vm_00;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar11;
  long lVar12;
  gravity_function_t *pgVar13;
  undefined8 uVar14;
  _Bool _Var15;
  ulong uVar16;
  gravity_callframe_t *pgVar17;
  gravity_list_t *pgVar18;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar19;
  gravity_value_t **stackstart;
  gravity_class_t *pgVar20;
  long lVar21;
  gravity_value_t *pgVar22;
  uint uVar23;
  error_type_t error_type;
  long lVar24;
  gravity_fiber_t *fiber;
  ulong uVar25;
  gravity_vm *pgVar26;
  uint uVar27;
  gravity_fiber_t *pgVar28;
  uint32_t uVar29;
  undefined8 *puVar30;
  undefined8 uVar31;
  gravity_value_t gVar32;
  uint local_50;
  gravity_value_t *local_38;
  
  pgVar20 = sender.isa;
  if ((closure == (gravity_closure_t *)0x0 || vm == (gravity_vm *)0x0) || (vm->aborted != false)) {
    return false;
  }
  pgVar10 = closure->f;
  if ((pgVar10 != (gravity_function_t *)0x0) && (pgVar10->tag == EXEC_TYPE_NATIVE)) {
    if ((pgVar10->field_9).field_0.bytecode == (uint32_t *)0x0) {
      return true;
    }
    if ((pgVar10->field_9).field_0.ninsts == 0) {
      return true;
    }
  }
  vm_00 = (gravity_vm *)vm->fiber;
  aVar11 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)closure->context;
  aVar19.n = sender.field_1.n;
  if ((gravity_object_t *)aVar11.n != (gravity_object_t *)0x0) {
    pgVar20 = (aVar11.p)->isa;
    aVar19 = aVar11;
  }
  uVar16 = (ulong)nparams;
  if (vm_00->nanon == 0) {
    uVar23 = nparams + 1;
    gravity_fiber_reassign((gravity_fiber_t *)vm_00,closure,(uint16_t)uVar23);
    pgVar22 = vm->fiber->stack;
    pgVar13 = closure->f;
    uVar5 = pgVar13->nparams;
    uVar8 = pgVar13->nlocals;
    uVar4 = pgVar13->ntemps;
    pgVar22->isa = pgVar20;
    (pgVar22->field_1).n = (gravity_int_t)aVar19;
    for (uVar25 = 0; (ulong)nparams << 4 != uVar25; uVar25 = uVar25 + 0x10) {
      puVar30 = (undefined8 *)((long)&params->isa + uVar25);
      uVar31 = puVar30[1];
      puVar2 = (undefined8 *)((long)&pgVar22[1].isa + uVar25);
      *puVar2 = *puVar30;
      puVar2[1] = uVar31;
    }
    uVar27 = (uint)uVar5;
    if (uVar5 < uVar23) {
      uVar27 = uVar23;
    }
    puVar30 = (undefined8 *)vm_00->recursioncount;
    uVar31 = *puVar30;
    if ((closure->f->tag == EXEC_TYPE_NATIVE) && ((closure->f->field_9).field_0.useargs == true)) {
      pgVar18 = gravity_list_from_array(vm,(uint)nparams,pgVar22 + 1);
      uVar25 = uVar16;
    }
    else {
      pgVar18 = (gravity_list_t *)0x0;
    }
    error_type = (error_type_t)uVar25;
    fiber = (gravity_fiber_t *)(ulong)(uVar27 + uVar8 + (uint)uVar4);
    puVar30[2] = pgVar18;
    uVar29 = 0;
  }
  else {
    lVar21 = vm_00->recursioncount;
    lVar24 = (ulong)(vm_00->nanon - 1) * 0x30;
    local_38 = *(gravity_value_t **)(lVar21 + 0x20 + lVar24);
    lVar12 = *(long *)(*(long *)(lVar21 + 0x18 + lVar24) + 0x38);
    uVar4 = *(ushort *)(lVar12 + 0x40);
    uVar5 = *(ushort *)(lVar21 + 0xc + lVar24);
    uVar8 = uVar4;
    if (uVar4 <= uVar5) {
      uVar8 = uVar5;
    }
    puVar30 = (undefined8 *)(lVar21 + lVar24);
    uVar31 = *(undefined8 *)(lVar21 + lVar24);
    uVar6 = *(ushort *)(lVar12 + 0x42);
    uVar7 = *(ushort *)(lVar12 + 0x44);
    uVar29 = (uint)uVar8 + (uint)uVar6 + (uint)uVar7;
    stackstart = (gravity_value_t **)(ulong)pgVar10->nparams;
    uVar23 = nparams + 1;
    if (pgVar10->nparams < uVar23) {
      stackstart = (gravity_value_t **)(ulong)uVar23;
    }
    pgVar28 = (gravity_fiber_t *)
              ((long)((long)local_38 +
                     (((ulong)(uVar29 * 0x10) +
                      (ulong)((uint)pgVar10->ntemps + (uint)pgVar10->nlocals + (int)stackstart) *
                      0x10) - *(long *)&vm_00->nccalls)) >> 4);
    fiber = (gravity_fiber_t *)0x0;
    if (0 < (long)pgVar28) {
      fiber = pgVar28;
    }
    pgVar28 = fiber;
    _Var15 = gravity_check_stack(vm_00,fiber,(uint32_t)&local_38,stackstart);
    pgVar22 = local_38;
    if (!_Var15) {
      *puVar30 = uVar31;
      report_runtime_error
                (vm,(error_type_t)pgVar28,
                 "Infinite loop detected. Current execution must be aborted.");
      return false;
    }
    uVar16 = (ulong)(uVar29 * 0x10);
    pgVar1 = (gravity_value_t *)((long)&local_38->isa + uVar16);
    *(gravity_class_t **)((long)&local_38->isa + uVar16) = pgVar20;
    ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)&local_38->field_1 + uVar16))->n =
         (gravity_int_t)aVar19;
    if (uVar4 < uVar5) {
      uVar4 = uVar5;
    }
    local_50 = (uint)uVar6;
    for (lVar21 = 0; (ulong)nparams << 4 != lVar21; lVar21 = lVar21 + 0x10) {
      puVar2 = (undefined8 *)((long)&params->isa + lVar21);
      uVar14 = puVar2[1];
      puVar3 = (undefined8 *)
               ((long)&local_38[1].isa + lVar21 + (ulong)((uVar7 + local_50 + (uint)uVar4) * 0x10));
      *puVar3 = *puVar2;
      puVar3[1] = uVar14;
    }
    *puVar30 = uVar31;
    pgVar26 = vm_00;
    pgVar17 = gravity_new_callframe(vm,(gravity_fiber_t *)vm_00);
    error_type = (error_type_t)pgVar26;
    if (pgVar17 == (gravity_callframe_t *)0x0) {
      return false;
    }
    pgVar17->closure = closure;
    pgVar17->stackstart = pgVar1;
    pgVar13 = closure->f;
    pgVar17->ip = (pgVar13->field_9).field_0.bytecode;
    pgVar17->dest = uVar29;
    pgVar17->nargs = (uint16_t)uVar23;
    pgVar17->outloop = false;
    if (pgVar13->tag == EXEC_TYPE_NATIVE) {
      if ((pgVar13->field_9).field_0.useargs == true) {
        error_type = (error_type_t)nparams;
        pgVar18 = gravity_list_from_array(vm,error_type,pgVar1 + 1);
      }
      else {
        pgVar18 = (gravity_list_t *)0x0;
      }
    }
    else {
      pgVar18 = (gravity_list_t *)0x0;
    }
    pgVar17->args = pgVar18;
    pgVar17->outloop = true;
  }
  gVar9 = pgVar10->tag;
  if (gVar9 == EXEC_TYPE_BRIDGED) {
    if (vm->delegate->bridge_execute != (gravity_bridge_execute)0x0) {
      gravity_gc_setenabled(vm,false);
      gVar32.field_1.n = aVar19.n;
      gVar32.isa = pgVar20;
      _Var15 = (*vm->delegate->bridge_execute)
                         (vm,pgVar10->xdata,gVar32,
                          (gravity_value_t *)((long)&pgVar22->isa + (ulong)(uVar29 << 4)),nparams,
                          0xfffffffe);
      gravity_gc_setenabled(vm,true);
      goto LAB_00126bd9;
    }
  }
  else {
    if (gVar9 == EXEC_TYPE_INTERNAL) {
      gravity_gc_setenabled(vm,false);
      _Var15 = (*(pgVar10->field_9).internal)
                         (vm,(gravity_value_t *)((long)&pgVar22->isa + (ulong)(uVar29 << 4)),nparams
                          ,0xfffffffe);
      gravity_gc_setenabled(vm,true);
      goto LAB_00126bd9;
    }
    if (gVar9 == EXEC_TYPE_NATIVE) {
      uVar23 = vm->nccalls + 1;
      vm->nccalls = uVar23;
      if (vm->maxccalls < uVar23) {
        *puVar30 = uVar31;
        report_runtime_error(vm,error_type,"Maximum number of nested C calls reached (%d).");
        return false;
      }
      _Var15 = gravity_vm_exec(vm);
      vm->nccalls = vm->nccalls - 1;
      goto LAB_00126bd9;
    }
  }
  _Var15 = false;
LAB_00126bd9:
  if (vm_00 == (gravity_vm *)vm->fiber) {
    if (pgVar10->tag != EXEC_TYPE_NATIVE) {
      vm_00->nanon = vm_00->nanon - 1;
    }
    *(ulong *)&vm_00->nccalls = *(long *)&vm_00->nccalls + ((ulong)fiber & 0xffffffff) * -0x10;
  }
  return _Var15;
}

Assistant:

bool gravity_vm_runclosure (gravity_vm *vm, gravity_closure_t *closure, gravity_value_t sender, gravity_value_t params[], uint16_t nparams) {
    if (!vm || !closure || vm->aborted) return false;

    // do not waste cycles on empty functions
    gravity_function_t *f = closure->f;
    if (f && (f->tag == EXEC_TYPE_NATIVE) && ((!f->bytecode) || (f->ninsts == 0))) return true;

    // current execution fiber
    gravity_fiber_t     *fiber = vm->fiber;
    gravity_value_t     *stackstart = NULL;
    uint32_t            rwin = 0;
	uint32_t			stacktopdelta = 0;
    
    // current frame and current instruction pointer
    gravity_callframe_t *frame;
    uint32_t            *ip;
	
    DEBUG_STACK();

    // self value is default to the context where the closure has been created (or set by the user)
    gravity_value_t selfvalue;

    // MSVC bug: designated initializer was prematurely evaluated
    if (closure->context) selfvalue = VALUE_FROM_OBJECT(closure->context);
    else selfvalue = sender;
    
    // we need a way to give user the ability to access the sender value from a closure
    
    // if fiber->nframes is not zero it means that this event has been recursively called
    // from somewhere inside the main function so we need to protect and correctly setup
    // the new activation frame
    if (fiber->nframes) {
        // current call frame
        frame = &fiber->frames[fiber->nframes - 1];

        // current top of the stack
        stackstart = frame->stackstart;

        // current instruction pointer
        ip = frame->ip;

        // compute register window
        rwin = FN_COUNTREG(frame->closure->f, frame->nargs);

        // check stack size
        uint32_t _rneed = FN_COUNTREG(f,nparams+1);
		stacktopdelta = (uint32_t)MAXNUM(stackstart + rwin + _rneed - vm->fiber->stacktop, 0);
        if (!gravity_check_stack(vm, vm->fiber, stacktopdelta, &stackstart)) {
            RUNTIME_ERROR("Infinite loop detected. Current execution must be aborted.");
        }
		
        // setup params (first param is self)
        SETVALUE(rwin, selfvalue);
        for (uint16_t i=0; i<nparams; ++i) {
            SETVALUE(rwin+i+1, params[i]);
        }

        STORE_FRAME();
        PUSH_FRAME(closure, &stackstart[rwin], rwin, nparams+1);
        SETFRAME_OUTLOOP(cframe);
    } else {
        // there are no execution frames when called outside main function
        gravity_fiber_reassign(vm->fiber, closure, nparams+1);
        stackstart = vm->fiber->stack;
		stacktopdelta = FN_COUNTREG(closure->f, nparams+1);
		
        // setup params (first param is self)
        SETVALUE(rwin, selfvalue);
        for (uint16_t i=0; i<nparams; ++i) {
            SETVALUE(rwin+i+1, params[i]);
        }

        // check if closure uses the special _args instruction
        frame = &fiber->frames[0];
        ip = frame->ip;
        frame->args = (USE_ARGS(closure)) ? gravity_list_from_array(vm, nparams, &stackstart[rwin]+1) : NULL;
    }

    // f can be native, internal or bridge because this function
    // is called also by convert_value2string
    // for example in Creo:
    // var mData = Data();
    // Console.write("data: " + mData);
    // mData.String is a bridged objc method
    DEBUG_STACK();

    bool result = false;
    switch (f->tag) {
        case EXEC_TYPE_NATIVE:
            ++vm->nccalls;
            if (vm->nccalls > vm->maxccalls) RUNTIME_ERROR("Maximum number of nested C calls reached (%d).", vm->maxccalls);
            result = gravity_vm_exec(vm);
            --vm->nccalls;
            break;

        case EXEC_TYPE_INTERNAL:
            BEGIN_TRUST_USERCODE(vm);
            result = f->internal(vm, &stackstart[rwin], nparams, GRAVITY_FIBER_REGISTER);
            END_TRUST_USERCODE(vm);
            break;

        case EXEC_TYPE_BRIDGED:
            if (vm->delegate->bridge_execute) {
                BEGIN_TRUST_USERCODE(vm);
                result = vm->delegate->bridge_execute(vm, f->xdata, selfvalue, &stackstart[rwin], nparams, GRAVITY_FIBER_REGISTER);
                END_TRUST_USERCODE(vm);
            }
            break;

        case EXEC_TYPE_SPECIAL:
            result = false;
            break;
    }
    
    if (fiber == vm->fiber) {
        // fix pointers ONLY if fiber remains the same
        if (f->tag != EXEC_TYPE_NATIVE) --fiber->nframes;
        fiber->stacktop -= stacktopdelta;
    }
	
    DEBUG_STACK();
    return result;
}